

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmGeneratorTarget *target)

{
  char *local_98;
  size_t local_90;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  local_48.View_._M_str = (this->HomeRelativeOutputPath)._M_dataplus._M_p;
  local_48.View_._M_len = (this->HomeRelativeOutputPath)._M_string_length;
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe])
            (&local_98);
  local_78.View_._M_len = local_90;
  local_78.View_._M_str = local_98;
  cmStrCat<>(__return_storage_ptr__,&local_48,&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir =
    cmStrCat(this->HomeRelativeOutputPath, this->GetTargetDirectory(target));
  return dir;
}